

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O1

void __thiscall leveldb::IteratorWrapper::Set(IteratorWrapper *this,Iterator *iter)

{
  int iVar1;
  undefined4 extraout_var;
  size_t extraout_RDX;
  
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[1])();
  }
  this->iter_ = iter;
  if (iter == (Iterator *)0x0) {
    this->valid_ = false;
  }
  else {
    iVar1 = (*iter->_vptr_Iterator[2])(iter);
    this->valid_ = SUB41(iVar1,0);
    if (SUB41(iVar1,0) != false) {
      iVar1 = (*this->iter_->_vptr_Iterator[8])();
      (this->key_).data_ = (char *)CONCAT44(extraout_var,iVar1);
      (this->key_).size_ = extraout_RDX;
    }
  }
  return;
}

Assistant:

void Set(Iterator *iter) {
            delete iter_;
            iter_ = iter;
            if (iter_ == NULL) {
                valid_ = false;
            } else {
                Update();
            }
        }